

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP3Serializer::CloseStream
          (BP3Serializer *this,IO *io,size_t *metadataStart,size_t *metadataCount,bool addMetadata)

{
  long lVar1;
  mapped_type *pmVar2;
  long *in_RCX;
  long *in_RDX;
  BP3Serializer *in_RSI;
  long *in_RDI;
  string *in_stack_00000028;
  IOChrono *in_stack_00000030;
  key_type *in_stack_ffffffffffffff08;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff10;
  allocator *paVar3;
  string *process;
  IOChrono *in_stack_ffffffffffffff50;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator<char> local_49;
  IO *in_stack_ffffffffffffffb8;
  BP3Serializer *in_stack_ffffffffffffffc0;
  
  process = (string *)&local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,"buffering",(allocator *)process);
  profiling::IOChrono::Start(in_stack_00000030,in_stack_00000028);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator(&local_49);
  if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0) & 1) != 0) {
    SerializeDataBuffer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  *in_RDX = *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x60);
  SerializeMetadataInData(in_RSI,SUB81((ulong)in_RDX >> 0x38,0),SUB81((ulong)in_RDX >> 0x30,0));
  *in_RCX = *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x60) - *in_RDX;
  if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x2e8) & 1) != 0) {
    lVar1 = *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"buffering",&local_81);
    pmVar2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::at(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pmVar2 = lVar1 + *pmVar2;
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  paVar3 = (allocator *)&stack0xffffffffffffff57;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"buffering",paVar3);
  profiling::IOChrono::Stop(in_stack_ffffffffffffff50,process);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  return;
}

Assistant:

void BP3Serializer::CloseStream(core::IO &io, size_t &metadataStart, size_t &metadataCount,
                                const bool addMetadata)
{

    m_Profiler.Start("buffering");
    if (m_MetadataSet.DataPGIsOpen)
    {
        SerializeDataBuffer(io);
    }

    metadataStart = m_Data.m_Position;

    SerializeMetadataInData(false, addMetadata);

    metadataCount = m_Data.m_Position - metadataStart;

    if (m_Profiler.m_IsActive)
    {
        m_Profiler.m_Bytes.at("buffering") += m_Data.m_Position;
    }
    m_Profiler.Stop("buffering");
}